

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

Type __thiscall wasm::Random::pick<wasm::Type>(Random *this,FeatureOptions<wasm::Type> *picker)

{
  uintptr_t uVar1;
  value_type *pvVar2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_30;
  
  items<wasm::Type>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::Type,std::allocator<wasm::Type>>>(this,&local_30);
  uVar1 = pvVar2->id;
  if (local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Type)uVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }